

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool __thiscall
Fossilize::ConcurrentDatabase::write_exported_concurrent_metadata
          (ConcurrentDatabase *this,uint8_t **data,size_t *size)

{
  ulong uVar1;
  uint8_t *puVar2;
  bool bVar3;
  size_t sVar4;
  uint64_t uVar5;
  uint64_t *total_count;
  ResourceTag tag;
  long lVar6;
  
  sVar4 = get_total_num_hashes(this);
  uVar1 = sVar4 * 8 + 0xb0;
  if (*size < uVar1) {
LAB_00138a46:
    bVar3 = false;
  }
  else {
    puVar2 = *data;
    puVar2[0] = 'S';
    puVar2[1] = '\x11';
    puVar2[2] = 'Q';
    puVar2[3] = '\x05';
    puVar2[4] = '_';
    puVar2[5] = '\v';
    puVar2[6] = 0xb1;
    puVar2[7] = '\0';
    *(ulong *)(puVar2 + 8) = uVar1;
    total_count = (uint64_t *)(puVar2 + 0x18);
    uVar5 = 0xb0;
    for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
      total_count[-1] = uVar5;
      bVar3 = write_exported_concurrent_hashes
                        (this,(ResourceTag)lVar6,
                         (ExportedMetadataConcurrentPrimedBlock *)(*data + uVar5),total_count);
      if (!bVar3) goto LAB_00138a46;
      uVar5 = uVar5 + *total_count * 8;
      total_count = total_count + 2;
    }
    *data = *data + uVar1;
    *size = *size - uVar1;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool write_exported_concurrent_metadata(uint8_t *&data, size_t &size) const
	{
		size_t total_hashes = get_total_num_hashes();
		size_t required = sizeof(ExportedMetadataHeader) + total_hashes * sizeof(ExportedMetadataConcurrentPrimedBlock);
		if (size < required)
			return false;

		auto *header = reinterpret_cast<ExportedMetadataHeader *>(data);
		header->magic = ExportedMetadataMagicConcurrent;
		header->size = required;

		size_t offset = sizeof(*header);
		for (unsigned i = 0; i < RESOURCE_COUNT; i++)
		{
			auto tag = ResourceTag(i);
			header->lists[i].offset = offset;
			if (!write_exported_concurrent_hashes(tag, reinterpret_cast<ExportedMetadataConcurrentPrimedBlock *>(data + offset),
			                                      header->lists[i].count))
			{
				return false;
			}
			offset += header->lists[i].count * sizeof(ExportedMetadataConcurrentPrimedBlock);
		}

		data += required;
		size -= required;
		return true;
	}